

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O0

QVariant * __thiscall QXpmHandler::option(QXpmHandler *this,ImageOption option)

{
  long lVar1;
  bool bVar2;
  int in_EDX;
  long in_RSI;
  QXpmHandler *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QXpmHandler *pQVar3;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 8) {
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)(in_RSI + 0x48));
  }
  else if (in_EDX == 0) {
    if (*(int *)(in_RSI + 0x10) == 2) {
      ::QVariant::QVariant((QVariant *)0x337796);
    }
    else {
      pQVar3 = in_RDI;
      if (*(int *)(in_RSI + 0x10) == 0) {
        bVar2 = readHeader(in_RDI);
        if (!bVar2) {
          ::QVariant::QVariant((QVariant *)0x3377be);
          in_RDI = pQVar3;
          goto LAB_00337867;
        }
      }
      QSize::QSize((QSize *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      ::QVariant::QVariant((QVariant *)in_RDI,local_10);
      in_RDI = pQVar3;
    }
  }
  else if (in_EDX == 0xe) {
    if (*(int *)(in_RSI + 0x10) == 2) {
      ::QVariant::QVariant((QVariant *)0x337805);
    }
    else {
      pQVar3 = in_RDI;
      if (*(int *)(in_RSI + 0x10) == 0) {
        bVar2 = readHeader(in_RDI);
        if (!bVar2) {
          ::QVariant::QVariant((QVariant *)0x33782a);
          in_RDI = pQVar3;
          goto LAB_00337867;
        }
      }
      if (*(int *)(in_RSI + 0x1c) < 0x101) {
        ::QVariant::QVariant((QVariant *)in_RDI,3);
        in_RDI = pQVar3;
      }
      else {
        ::QVariant::QVariant((QVariant *)in_RDI,0);
        in_RDI = pQVar3;
      }
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0x337867);
  }
LAB_00337867:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QXpmHandler::option(ImageOption option) const
{
    if (option == Name) {
        return fileName;
    } else if (option == Size) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QXpmHandler*>(this)->readHeader())
            return QVariant();
        return QSize(width, height);
    } else if (option == ImageFormat) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QXpmHandler*>(this)->readHeader())
            return QVariant();
        // If we have more than 256 colors in the table, we need to
        // figure out, if it contains transparency. That means reading
        // the whole color table, which is too much work work pre-checking
        // the image format
        if (ncols <= 256)
            return QImage::Format_Indexed8;
        else
            return QImage::Format_Invalid;
    }

    return QVariant();
}